

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceHandle param_2,InterfaceType what,
          string_view key,string_view type,string_view units)

{
  _Map_pointer ppBVar1;
  _Map_pointer ppBVar2;
  _Elt_pointer pBVar3;
  _Elt_pointer pBVar4;
  _Elt_pointer pBVar5;
  _Elt_pointer pBVar6;
  _Elt_pointer pBVar7;
  InterfaceType local_59;
  InterfaceHandle local_58;
  GlobalFederateId local_54;
  string local_50;
  
  ppBVar1 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  ppBVar2 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pBVar7 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pBVar3 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  pBVar4 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  pBVar5 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_59 = what;
  local_58.hid = param_2.hid;
  local_54.gid = fed_id.gid;
  if (key._M_len == 0) {
    generateName_abi_cxx11_(&local_50,this,what);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,key._M_str,key._M_str + key._M_len);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>> *)this,
             &local_54,&local_58,&local_59,&local_50,&type,&units);
  pBVar6 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar6 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar6 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  addSearchFields(this,pBVar6 + -1,
                  (int)((ulong)((long)pBVar4 - (long)pBVar5) >> 3) * 0x286bca1b +
                  (int)((ulong)((long)pBVar7 - (long)pBVar3) >> 3) * 0x286bca1b +
                  ((int)((ulong)((long)ppBVar1 - (long)ppBVar2) >> 3) + -1 +
                  (uint)(ppBVar1 == (_Map_pointer)0x0)) * 3);
  pBVar7 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar7 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar7 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return pBVar7 + -1;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceHandle local_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    auto index = static_cast<int32_t>(handles.size());
    const std::string actKey = (!key.empty()) ? std::string{key} : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), index);
    return handles.back();
}